

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  Chunk difference_1;
  Chunk difference;
  int i;
  Chunk borrow;
  int offset;
  Bignum *other_local;
  Bignum *this_local;
  
  bVar1 = IsClamped(this);
  if (!bVar1) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd4,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  bVar1 = IsClamped(other);
  if (!bVar1) {
    __assert_fail("other.IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd5,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  bVar1 = LessEqual(other,this);
  if (!bVar1) {
    __assert_fail("LessEqual(other, *this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd7,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  Align(this,other);
  iVar2 = other->exponent_ - this->exponent_;
  difference = 0;
  difference_1 = 0;
  while( true ) {
    if (other->used_digits_ <= (int)difference_1) {
      for (; difference != 0; difference = uVar3 - difference >> 0x1f) {
        puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar2);
        uVar3 = *puVar4;
        puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar2);
        *puVar4 = uVar3 - difference & 0xfffffff;
        difference_1 = difference_1 + 1;
      }
      Clamp(this);
      return;
    }
    if (1 < difference) break;
    puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar2);
    uVar3 = *puVar4;
    puVar4 = Vector<unsigned_int>::operator[](&other->bigits_,difference_1);
    uVar3 = (uVar3 - *puVar4) - difference;
    puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar2);
    *puVar4 = uVar3 & 0xfffffff;
    difference = uVar3 >> 0x1f;
    difference_1 = difference_1 + 1;
  }
  __assert_fail("(borrow == 0) || (borrow == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0xdf,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}